

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvt2triphone.c
# Opt level: O3

int cvt2triphone(acmod_set_t *acmod_set,acmod_id_t *phone,char *btw_mark,uint32 n_phone)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  acmod_id_t aVar4;
  uint32 uVar5;
  uint32 uVar6;
  acmod_id_t aVar7;
  word_posn_t wVar8;
  acmod_id_t aVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  acmod_id_t aVar15;
  ulong uVar16;
  uint id;
  word_posn_t local_60;
  
  aVar4 = acmod_set_name2id(acmod_set,"SIL");
  uVar5 = acmod_set_n_multi(acmod_set);
  if (uVar5 == 0) {
    if (cvt2triphone_spoke_my_peace == '\0') {
      fflush(_stdout);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
              ,199,"no multiphones defined, no conversion done\n");
      cvt2triphone_spoke_my_peace = '\x01';
      fflush(_stderr);
    }
  }
  else {
    uVar13 = n_phone - 1;
    uVar14 = (ulong)uVar13;
    aVar15 = aVar4;
    if (uVar13 == 0) {
      local_60 = WORD_POSN_END;
    }
    else {
      local_60 = WORD_POSN_END;
      uVar16 = 0;
      do {
        uVar2 = phone[uVar16 + 1];
        uVar5 = acmod_set_has_attrib(acmod_set,uVar2 & 0xff,"filler");
        uVar3 = phone[uVar16];
        id = uVar3 & 0xff;
        local_60 = btw_posn(btw_mark[uVar16],local_60);
        uVar6 = acmod_set_has_attrib(acmod_set,id,"filler");
        aVar9 = aVar4;
        if (uVar6 == 0) {
          if (uVar5 != 0) {
            uVar2 = aVar4;
          }
          aVar7 = acmod_set_tri2id(acmod_set,id,aVar15 & 0xff,uVar2 & 0xff,local_60);
          aVar9 = uVar3;
          if (aVar7 == 0xffffffff) {
            wVar8 = WORD_POSN_BEGIN;
            do {
              aVar7 = acmod_set_tri2id(acmod_set,id,aVar15 & 0xff,uVar2 & 0xff,wVar8);
              if (aVar7 != 0xffffffff) goto LAB_00129306;
              wVar8 = wVar8 + WORD_POSN_END;
            } while (wVar8 != WORD_POSN_UNDEFINED);
          }
          else {
LAB_00129306:
            phone[uVar16] = aVar7;
          }
        }
        aVar15 = aVar9;
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar14);
    }
    bVar1 = (byte)phone[uVar14];
    uVar5 = acmod_set_has_attrib(acmod_set,(uint)bVar1,"filler");
    if (uVar5 == 0) {
      if (uVar13 != 0) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
                ,0x10b,"utt does not end with filler phone\n");
      }
      if (btw_mark[uVar14] == '\0') {
        __assert_fail("btw_mark[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
                      ,0x110,"int cvt2triphone(acmod_set_t *, acmod_id_t *, char *, uint32)");
      }
      wVar8 = btw_posn(btw_mark[uVar14],local_60);
      aVar9 = acmod_set_tri2id(acmod_set,(uint)bVar1,aVar15 & 0xff,aVar4 & 0xff,wVar8);
      if (aVar9 == 0xffffffff) {
        pcVar10 = acmod_set_id2name(acmod_set,(uint)bVar1);
        pcVar11 = acmod_set_id2name(acmod_set,aVar15 & 0xff);
        pcVar12 = acmod_set_id2name(acmod_set,aVar4 & 0xff);
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
                ,0x11d,"Missing triphone, (%s %s %s %c), left as CI phone",pcVar10,pcVar11,pcVar12,
                (ulong)(uint)(int)"besiu"[wVar8]);
      }
      else {
        phone[uVar14] = aVar9;
      }
    }
  }
  return 0;
}

Assistant:

int
cvt2triphone(acmod_set_t *acmod_set,
	     acmod_id_t *phone,
	     char *btw_mark,
	     uint32 n_phone)
{
    uint32 i;
    ci_acmod_id_t b = (ci_acmod_id_t)NO_ACMOD;
    ci_acmod_id_t l = (ci_acmod_id_t)NO_ACMOD;
    ci_acmod_id_t r = (ci_acmod_id_t)NO_ACMOD;
    acmod_id_t tri_id;
    word_posn_t posn;
    static int spoke_my_peace = FALSE;
    acmod_id_t sil = acmod_set_name2id(acmod_set, "SIL");
    char *word_posn_map = WORD_POSN_CHAR_MAP;

    if (acmod_set_n_multi(acmod_set) == 0) {
	/* nothing to do */

	if (!spoke_my_peace) {
	    fflush(stdout);
	    E_INFO("no multiphones defined, no conversion done\n");
	    spoke_my_peace = TRUE;
	    fflush(stderr);
	}
	return S3_SUCCESS;
    }

    for (i = 0, l = r = sil, posn = WORD_POSN_END; i < n_phone-1; i++) {
	/* get new right context */
	r = phone[i+1];
	if (acmod_set_has_attrib(acmod_set, r, "filler"))
	    r = sil;
	
	b = phone[i];

	/* determine between word position {begin|start|single} */
	posn = btw_posn(btw_mark[i], posn);
	
	if (!acmod_set_has_attrib(acmod_set, b, "filler")) {
	    tri_id = acmod_set_tri2id(acmod_set,
				      b, l, r, posn);
	    if (tri_id != NO_ACMOD) {
		/* got good triphone, so replace CI w/ tri */
		phone[i] = tri_id;
	    }
	    else {
		    /* Try to back off to other word positions */
		    int j;

		    for (j = 0; j < N_WORD_POSN; ++j) {
			    tri_id = acmod_set_tri2id(acmod_set,
						      b, l, r, j);
			    if (tri_id != NO_ACMOD) {
				    phone[i] = tri_id;
				    break;
			    }
		    }
		    if (j == N_WORD_POSN) {
#if 0
			    E_WARN("Missing triphone, (%s %s %s %c), left as CI phone\n",
				   acmod_set_id2name(acmod_set, b),
				   acmod_set_id2name(acmod_set, l),
				   acmod_set_id2name(acmod_set, r),
				   word_posn_map[(int)posn]);
#endif
		    }
	    }
	}
	else {
	    /* phone[i] is a filler phone, so just leave it as is */
	    /* Change b to SIL for triphone context purposes */
	    b = sil;
	}

	/* Set next left context is the current base phone (where filler phones
	 * are mapped to SIL) */
	l = b;
    }

    b = phone[i];
    r = sil;

    /* At this point, b is the right context of
     * the next to last phone.  Typically, this
     * is sil or some other filler phone. */

    if (!acmod_set_has_attrib(acmod_set, b, "filler")) {
	if (i > 0) {
	    E_WARN("utt does not end with filler phone\n");

	    r = sil;
	}
	
	assert( btw_mark[i] );
	
	posn = btw_posn(btw_mark[i], posn);
	
	tri_id = acmod_set_tri2id(acmod_set,
				  b, l, r, posn);
	if (tri_id != NO_ACMOD)
	    phone[i] = tri_id;
	else {
	    E_WARN("Missing triphone, (%s %s %s %c), left as CI phone",
		   acmod_set_id2name(acmod_set, b),
		   acmod_set_id2name(acmod_set, l),
		   acmod_set_id2name(acmod_set, r),
		   word_posn_map[(int)posn]);
	}
    }

    return S3_SUCCESS;
}